

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_interp_best_tri_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_INT cell_00;
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  uint unaff_EBP;
  char *pcVar5;
  long lVar6;
  REF_STATUS ref_private_macro_code_rxs;
  double dVar7;
  REF_INT tet0;
  REF_INT tet1;
  REF_DBL current_bary3 [3];
  REF_INT tri_nodes [27];
  REF_INT tet_nodes [27];
  int local_17c;
  int local_178;
  int local_174;
  REF_CELL local_170;
  double local_168;
  REF_NODE local_160;
  REF_DBL *local_158;
  REF_CELL local_150;
  double local_148 [4];
  REF_INT *local_128;
  REF_DBL *local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  local_150 = ref_interp->from_tri;
  local_170 = ref_interp->from_tet;
  local_160 = ref_interp->from_grid->node;
  local_158 = xyz;
  local_128 = cell;
  local_120 = bary;
  if (ref_list->n < 1) {
    local_17c = -1;
  }
  else {
    local_168 = -999.0;
    local_17c = -1;
    lVar6 = 0;
    do {
      cell_00 = ref_list->value[lVar6];
      uVar2 = ref_cell_nodes(local_150,cell_00,local_118);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1d0,"ref_interp_best_tri_in_list",(ulong)uVar2,"cell");
        return uVar2;
      }
      uVar2 = ref_node_bary3d(local_160,local_118,local_158,local_148);
      if ((uVar2 & 0xfffffffb) != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1d2,"ref_interp_best_tri_in_list",(ulong)uVar2,"bary");
        unaff_EBP = uVar2;
      }
      if (uVar2 != 4) {
        if (uVar2 != 0) {
          return unaff_EBP;
        }
        dVar7 = local_148[0];
        if (local_148[1] <= local_148[0]) {
          dVar7 = local_148[1];
        }
        if (local_148[2] <= dVar7) {
          dVar7 = local_148[2];
        }
        if ((local_17c == -1) || (local_168 < dVar7)) {
          local_17c = cell_00;
          local_168 = dVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < ref_list->n);
  }
  if (local_17c == -1) {
    pcVar5 = "failed to find tri";
    uVar4 = 0x1dd;
  }
  else {
    uVar2 = ref_cell_nodes(local_150,local_17c,local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x1df,"ref_interp_best_tri_in_list",(ulong)uVar2,"cell");
      return uVar2;
    }
    uVar2 = ref_node_bary3d(local_160,local_118,local_158,local_148);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x1e0,"ref_interp_best_tri_in_list",(ulong)uVar2,"bary3d");
      return uVar2;
    }
    local_118[3] = local_118[0];
    uVar2 = ref_cell_with_face(local_170,local_118,&local_178,&local_174);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x1e2,"ref_interp_best_tri_in_list",(ulong)uVar2,"find with face");
      return uVar2;
    }
    if (local_178 != -1) {
      if ((long)local_174 != -1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x1e4,"ref_interp_best_tri_in_list","found two tets for boundary face",
               0xffffffffffffffff,(long)local_174);
        unaff_EBP = 1;
      }
      if (local_174 != -1) {
        return unaff_EBP;
      }
      *local_128 = local_178;
      uVar2 = ref_cell_nodes(local_170,local_178,local_a8);
      if (uVar2 == 0) {
        lVar6 = 0;
        do {
          local_120[lVar6] = 0.0;
          iVar1 = local_a8[lVar6];
          lVar3 = 0;
          do {
            if (local_118[lVar3] == iVar1) {
              local_120[lVar6] = local_148[lVar3];
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x1e7,"ref_interp_best_tri_in_list",(ulong)uVar2,"cell");
      return uVar2;
    }
    pcVar5 = "no tet for tri";
    uVar4 = 0x1e3;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar4,
         "ref_interp_best_tri_in_list",pcVar5);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_best_tri_in_list(REF_INTERP ref_interp,
                                                      REF_LIST ref_list,
                                                      REF_DBL *xyz,
                                                      REF_INT *cell,
                                                      REF_DBL *bary) {
  REF_CELL ref_tri = ref_interp_from_tri(ref_interp);
  REF_CELL ref_tet = ref_interp_from_tet(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, tri_candidate, best_candidate, tet0, tet1, i, j;
  REF_DBL current_bary3[3];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    tri_candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_tri, tri_candidate, tri_nodes), "cell");
    status = ref_node_bary3d(ref_node, tri_nodes, xyz, current_bary3);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary3[0], current_bary3[1]), current_bary3[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = tri_candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find tri");

  RSS(ref_cell_nodes(ref_tri, best_candidate, tri_nodes), "cell");
  RSS(ref_node_bary3d(ref_node, tri_nodes, xyz, current_bary3), "bary3d");
  tri_nodes[3] = tri_nodes[0];
  RSS(ref_cell_with_face(ref_tet, tri_nodes, &tet0, &tet1), "find with face");
  RUS(REF_EMPTY, tet0, "no tet for tri");
  REIS(REF_EMPTY, tet1, "found two tets for boundary face");

  *cell = tet0;
  RSS(ref_cell_nodes(ref_tet, tet0, tet_nodes), "cell");
  for (i = 0; i < 4; i++) {
    bary[i] = 0.0;
    for (j = 0; j < 3; j++) {
      if (tri_nodes[j] == tet_nodes[i]) bary[i] = current_bary3[j];
    }
  }

  return REF_SUCCESS;
}